

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

uint32 rw::d3d8::getSizeNativeTexture(Texture *tex)

{
  uint uVar1;
  int32 iVar2;
  int32 iVar3;
  uint32 uVar4;
  int level;
  
  iVar2 = Raster::getNumLevels(tex->raster);
  uVar1 = tex->raster->format;
  uVar4 = 0xe4;
  if ((uVar1 >> 0xe & 1) == 0) {
    uVar4 = (uVar1 & 0x2000) >> 3 | 100;
  }
  if (0 < iVar2) {
    level = 0;
    do {
      iVar3 = d3d::getLevelSize(tex->raster,level);
      uVar4 = uVar4 + iVar3 + 4;
      level = level + 1;
    } while (iVar2 != level);
  }
  return uVar4;
}

Assistant:

uint32
getSizeNativeTexture(Texture *tex)
{
	uint32 size = 12 + 72 + 16;
	int32 levels = tex->raster->getNumLevels();
	if(tex->raster->format & Raster::PAL4)
		size += 4*32;
	else if(tex->raster->format & Raster::PAL8)
		size += 4*256;
	for(int32 i = 0; i < levels; i++)
		size += 4 + getLevelSize(tex->raster, i);
	return size;
}